

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O0

int __thiscall TCLAP::XorHandler::check(XorHandler *this,Arg *a)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  undefined8 uVar5;
  reference ppAVar6;
  reference this_00;
  Arg *in_RSI;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *in_RDI;
  string *in_stack_00000040;
  ArgVectorIterator it_1;
  CmdLineParseException *in_stack_00000050;
  ArgVectorIterator it;
  ArgVectorIterator ait;
  int i;
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_fffffffffffffef8;
  Arg *in_stack_ffffffffffffff00;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  in_stack_ffffffffffffff18;
  Arg *pAVar7;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  in_stack_ffffffffffffff40;
  undefined1 local_a8 [88];
  Arg **local_50;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_48;
  Arg **local_40;
  Arg **local_38;
  Arg **local_30;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_28;
  uint local_1c;
  Arg *local_18;
  uint local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  while( true ) {
    uVar3 = (ulong)local_1c;
    sVar4 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size(in_RDI);
    if (sVar4 <= uVar3) {
      uVar2 = (*local_18->_vptr_Arg[5])();
      local_4 = (uint)((uVar2 & 1) != 0);
      return local_4;
    }
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](in_RDI,(long)(int)local_1c);
    local_30 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                                 (in_stack_fffffffffffffef8);
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](in_RDI,(long)(int)local_1c);
    local_38 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                 (in_stack_fffffffffffffef8);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<TCLAP::Arg**,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>,TCLAP::Arg_const*>
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          (Arg **)in_stack_ffffffffffffff08);
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](in_RDI,(long)(int)local_1c);
    local_40 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                 (in_stack_fffffffffffffef8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_fffffffffffffef8);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::operator[](in_RDI,(long)(int)local_1c);
  local_48._M_current =
       (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                         (in_stack_fffffffffffffef8);
  while( true ) {
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](in_RDI,(long)(int)local_1c);
    local_50 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                 (in_stack_fffffffffffffef8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    pAVar7 = local_18;
    ppAVar6 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&local_48);
    if (pAVar7 != *ppAVar6) {
      ppAVar6 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_48);
      bVar1 = Arg::isSet(*ppAVar6);
      if (bVar1) {
        uVar5 = __cxa_allocate_exception(0x68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff40._M_current,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
        ppAVar6 = __gnu_cxx::
                  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                  ::operator*(&local_48);
        (*(*ppAVar6)->_vptr_Arg[7])(local_a8);
        CmdLineParseException::CmdLineParseException
                  (in_stack_00000050,(string *)it_1._M_current,in_stack_00000040);
        __cxa_throw(uVar5,&CmdLineParseException::typeinfo,
                    CmdLineParseException::~CmdLineParseException);
      }
    }
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator++(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::operator[](in_RDI,(long)(int)local_1c);
  std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(in_stack_fffffffffffffef8);
  while( true ) {
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](in_RDI,(long)(int)local_1c);
    std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(in_stack_fffffffffffffef8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    in_stack_ffffffffffffff00 = local_18;
    ppAVar6 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                           *)&stack0xffffffffffffff40);
    if (in_stack_ffffffffffffff00 != *ppAVar6) {
      ppAVar6 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                             *)&stack0xffffffffffffff40);
      Arg::xorSet(*ppAVar6);
    }
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator++(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  ppAVar6 = __gnu_cxx::
            __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
            ::operator*(&local_28);
  uVar2 = (*(*ppAVar6)->_vptr_Arg[0xb])();
  if ((uVar2 & 1) == 0) {
    this_00 = std::
              vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ::operator[](in_RDI,(long)(int)local_1c);
    sVar4 = std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::size(this_00);
    return (int)sVar4;
  }
  return 0;
}

Assistant:

inline int XorHandler::check( const Arg* a ) 
{
	// iterate over each XOR list
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
	{
		// if the XOR list contains the arg..
		ArgVectorIterator ait = std::find( _orList[i].begin(), 
		                                   _orList[i].end(), a );
		if ( ait != _orList[i].end() )
		{
			// first check to see if a mutually exclusive switch
			// has not already been set
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) && (*it)->isSet() )
					throw(CmdLineParseException(
					      "Mutually exclusive argument already set!",
					      (*it)->toString()));

			// go through and set each arg that is not a
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) )
					(*it)->xorSet();

			// return the number of required args that have now been set
			if ( (*ait)->allowMore() )
				return 0;
			else
				return static_cast<int>(_orList[i].size());
		}
	}

	if ( a->isRequired() )
		return 1;
	else
		return 0;
}